

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::PrecisionCase::
testStatement<vkt::shaderexecutor::InTypes<tcu::Vector<float,2>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>,vkt::shaderexecutor::OutTypes<tcu::Matrix<float,2,3>,vkt::shaderexecutor::Void>>
          (PrecisionCase *this,
          Variables<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>
          *variables,Statement *stmt)

{
  string *this_00;
  ShaderSpec *this_01;
  vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *this_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pSVar2;
  char *__s;
  size_t sVar3;
  long *plVar4;
  size_type *psVar5;
  ostringstream os;
  Environment env;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  Symbol local_1d8 [2];
  ios_base local_168 [264];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"precision ",10);
  __s = glu::getPrecisionName((this->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)&local_1f8 +
                    (int)*(undefined8 *)(local_1d8[0].name._M_dataplus._M_p + -0x18) + 0x20);
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,__s,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8," float;\n",8);
  std::__cxx11::stringbuf::str();
  this_00 = &(this->m_spec).globalDeclarations;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
  std::ios_base::~ios_base(local_168);
  if ((this->m_extension)._M_string_length != 0) {
    std::operator+(&local_1f8,"#extension ",&this->m_extension);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_1f8);
    paVar1 = &local_1d8[0].name.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_1d8[0].name.field_2._0_8_ = *psVar5;
      local_1d8[0].name.field_2._8_8_ = plVar4[3];
      local_1d8[0].name._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1d8[0].name.field_2._0_8_ = *psVar5;
      local_1d8[0].name._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_1d8[0].name._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)this_00,(string *)local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8[0].name._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d8[0].name._M_dataplus._M_p,
                      local_1d8[0].name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
  }
  this_01 = &this->m_spec;
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::resize
            (&this_01->inputs,2);
  makeSymbol<tcu::Vector<float,3>>
            (local_1d8,this,
             (variables->in1).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.m_ptr);
  pSVar2 = (this_01->inputs).
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=((string *)(pSVar2 + 1),(string *)local_1d8);
  glu::VarType::operator=(&pSVar2[1].varType,&local_1d8[0].varType);
  glu::VarType::~VarType(&local_1d8[0].varType);
  paVar1 = &local_1d8[0].name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8[0].name._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8[0].name._M_dataplus._M_p,
                    local_1d8[0].name.field_2._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Vector<float,2>>
            (local_1d8,this,
             (variables->in0).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr);
  pSVar2 = (this_01->inputs).
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=((string *)pSVar2,(string *)local_1d8);
  glu::VarType::operator=(&pSVar2->varType,&local_1d8[0].varType);
  glu::VarType::~VarType(&local_1d8[0].varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8[0].name._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8[0].name._M_dataplus._M_p,
                    local_1d8[0].name.field_2._M_allocated_capacity + 1);
  }
  this_02 = &(this->m_spec).outputs;
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::resize
            (this_02,1);
  makeSymbol<tcu::Matrix<float,2,3>>
            (local_1d8,this,
             (variables->out0).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.m_ptr)
  ;
  pSVar2 = (this_02->
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           )._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=((string *)pSVar2,(string *)local_1d8);
  glu::VarType::operator=(&pSVar2->varType,&local_1d8[0].varType);
  glu::VarType::~VarType(&local_1d8[0].varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8[0].name._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8[0].name._M_dataplus._M_p,
                    local_1d8[0].name.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
  (*stmt->_vptr_Statement[2])(stmt,local_1d8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
  std::ios_base::~ios_base(local_168);
  std::__cxx11::string::operator=((string *)&(this->m_spec).source,(string *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>& variables, const Statement& stmt)
{
	const int		inCount		= numInputs<In>();
	const int		outCount	= numOutputs<Out>();
	Environment		env;		// Hoisted out of the inner loop for optimization.

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		m_spec.globalDeclarations = os.str();
	}

	if (!m_extension.empty())
		m_spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	m_spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: m_spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	m_spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	m_spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	m_spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	m_spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	m_spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	m_spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	m_spec.source = de::toString(stmt);
}